

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

void __thiscall sophia_interface::debugNonLUND(sophia_interface *this,string *errm,bool stopProgram)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  runtime_error *this_00;
  sophia_interface *this_01;
  double (*padVar4) [2000];
  long lVar5;
  long lVar6;
  double dVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------------",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"debugNonLUND: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(errm->_M_dataplus)._M_p,errm->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"np = ",5);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->np);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (0 < this->np) {
    padVar4 = this->p;
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID = ",5);
      iVar1 = ID_sophia_to_PDG(this->LLIST[lVar5]);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      lVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|P\t",3);
        poVar2 = std::ostream::_M_insert<double>(*(double *)((long)*padVar4 + lVar6));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        lVar6 = lVar6 + 16000;
      } while (lVar6 != 80000);
      lVar5 = lVar5 + 1;
      padVar4 = (double (*) [2000])(*padVar4 + 1);
    } while (lVar5 < this->np);
  }
  this_01 = (sophia_interface *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"test random number: ",0x14);
  dVar7 = RLU(this_01,false);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------------",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (!stopProgram) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"stopped by debugNonLUND.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sophia_interface::debugNonLUND(std::string errm, bool stopProgram) {
    std::cout << "------------------------------------" << std::endl;
    std::cout << "debugNonLUND: " << errm << std::endl;
    std::cout << "np = "<< np << std::endl;
    for (int i = 0; i < np; ++i) {
        std::cout << "ID = " << ID_sophia_to_PDG(LLIST[i]) << std::endl;
        for (int j = 0; j < 5; ++j) {
            std::cout << "|P\t" << p[j][i] << std::endl;
        }
    }
    std::cout << "test random number: " << RNDM() << std::endl;
    std::cout << "------------------------------------" << std::endl;
    if (stopProgram) throw std::runtime_error("stopped by debugNonLUND.");
}